

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  void *pvVar9;
  long lVar10;
  char *text;
  char *pcVar11;
  ImFontGlyph *pIVar12;
  uint uVar13;
  float scale;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint c;
  uint local_8c;
  undefined1 local_88 [16];
  ulong local_70;
  uint *local_68;
  ImDrawVert *local_60;
  uint local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  char *local_38;
  
  if (text_end == (char *)0x0) {
    sVar6 = strlen(text_begin);
    text_end = text_begin + sVar6;
  }
  fVar18 = (float)(int)pos->y;
  local_88 = ZEXT416((uint)fVar18);
  if (fVar18 < clip_rect->w || fVar18 == clip_rect->w) {
    _local_48 = ZEXT416((uint)pos->x);
    scale = size / this->FontSize;
    fVar19 = this->FontSize * scale;
    fVar18 = fVar18 + fVar19;
    if ((fVar18 < clip_rect->y) && (text_begin < text_end && fVar18 < clip_rect->y)) {
      do {
        local_88 = ZEXT416((uint)fVar18);
        pcVar7 = (char *)memchr(text_begin,10,(long)text_end - (long)text_begin);
        if (wrap_width <= 0.0) {
          text_begin = pcVar7 + 1;
          if (pcVar7 == (char *)0x0) {
            text_begin = text_end;
          }
        }
        else {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = text_end;
          }
          pcVar8 = CalcWordWrapPositionA(this,scale,text_begin,pcVar7,wrap_width);
          pcVar7 = pcVar8;
          if (pcVar8 < text_end) {
            do {
              if ((*pcVar8 != ' ') && (pcVar7 = pcVar8, *pcVar8 != '\t')) break;
              pcVar8 = pcVar8 + 1;
              pcVar7 = text_end;
            } while (pcVar8 != text_end);
          }
          text_begin = pcVar7 + (*pcVar7 == '\n');
        }
        fVar18 = fVar19 + (float)local_88._0_4_;
      } while ((fVar18 < clip_rect->y) && (text_begin < text_end));
    }
    pcVar7 = text_end;
    if ((wrap_width <= 0.0) && (10000 < (long)text_end - (long)text_begin)) {
      fVar18 = clip_rect->w;
      pcVar7 = text_begin;
      fVar20 = (float)local_88._0_4_;
      while ((fVar20 < fVar18 && (pcVar7 < text_end))) {
        pvVar9 = memchr(pcVar7,10,(long)text_end - (long)pcVar7);
        pcVar7 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          pcVar7 = text_end;
        }
        fVar20 = fVar20 + fVar19;
      }
    }
    if (text_begin != pcVar7) {
      local_48._4_4_ = (float)(int)(float)local_48._4_4_;
      local_48._0_4_ = (float)(int)(float)local_48._0_4_;
      fStack_40 = (float)(int)fStack_40;
      fStack_3c = (float)(int)fStack_3c;
      iVar5 = (int)pcVar7 - (int)text_begin;
      local_50 = iVar5 * 6;
      local_4c = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_50,iVar5 * 4);
      local_60 = draw_list->_VtxWritePtr;
      local_68 = draw_list->_IdxWritePtr;
      local_70 = (ulong)draw_list->_VtxCurrentIdx;
      local_54 = col | 0xffffff;
      pcVar8 = (char *)0x0;
      fVar18 = (float)local_48._0_4_;
      fVar20 = (float)local_48._0_4_;
      do {
        if (pcVar7 <= text_begin) break;
        text = text_begin;
        fVar14 = (float)local_88._0_4_;
        uVar15 = local_88._4_4_;
        uVar16 = local_88._8_4_;
        uVar17 = local_88._12_4_;
        fVar29 = fVar20;
        local_38 = pcVar8;
        while (pcVar11 = local_38, 0.0 < wrap_width) {
          if (pcVar8 == (char *)0x0) {
            pcVar8 = CalcWordWrapPositionA(this,scale,text,pcVar7,(fVar18 - fVar29) + wrap_width);
            uVar15 = 0;
            uVar16 = 0;
            uVar17 = 0;
            fVar18 = (float)local_48._0_4_;
          }
          if (text < pcVar8) {
            local_88._4_4_ = uVar15;
            local_88._0_4_ = fVar14;
            local_88._8_4_ = uVar16;
            local_88._12_4_ = uVar17;
            pcVar11 = pcVar8;
            text_begin = text;
            fVar20 = fVar29;
            break;
          }
          fVar14 = fVar14 + fVar19;
          if (clip_rect->w <= fVar14 && fVar14 != clip_rect->w) goto LAB_001a2fac;
          do {
            if ((*text != ' ') && (pcVar8 = text, *text != '\t')) break;
            text = text + 1;
            pcVar8 = pcVar7;
          } while (text != pcVar7);
          text = pcVar8 + (*pcVar8 == '\n');
          pcVar8 = (char *)0x0;
          fVar29 = fVar18;
          if (pcVar7 <= text) goto LAB_001a2fac;
        }
        local_8c = (uint)*text_begin;
        lVar10 = 1;
        if (*text_begin < '\0') {
          iVar5 = ImTextCharFromUtf8(&local_8c,text_begin,pcVar7);
          lVar10 = (long)iVar5;
          fVar18 = (float)local_48._0_4_;
        }
        if (local_8c < 0x20) {
          if (local_8c == 0xd) goto LAB_001a2f9f;
          if (local_8c != 10) goto LAB_001a2cfc;
          local_88._0_4_ = (float)local_88._0_4_ + fVar19;
          bVar4 = clip_rect->w <= (float)local_88._0_4_ && (float)local_88._0_4_ != clip_rect->w;
          fVar20 = fVar18;
        }
        else {
LAB_001a2cfc:
          if (((local_8c & 0xffff) < (uint)(this->IndexLookup).Size) &&
             (uVar3 = (this->IndexLookup).Data[(ushort)local_8c], uVar3 != 0xffff)) {
            pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar3 * 0x28);
          }
          else {
            pIVar12 = this->FallbackGlyph;
          }
          if (pIVar12 != (ImFontGlyph *)0x0) {
            fVar14 = pIVar12->AdvanceX * scale;
            if (((undefined1  [40])*pIVar12 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar26 = pIVar12->X0 * scale + fVar20;
              fVar29 = clip_rect->z;
              bVar4 = true;
              if (fVar26 <= fVar29) {
                fVar27 = pIVar12->X1 * scale + fVar20;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar27) {
                  fVar28 = pIVar12->Y0 * scale + (float)local_88._0_4_;
                  fVar23 = pIVar12->Y1 * scale + (float)local_88._0_4_;
                  fVar21 = pIVar12->U0;
                  fVar25 = pIVar12->V0;
                  fVar24 = pIVar12->U1;
                  fVar22 = pIVar12->V1;
                  if (cpu_fine_clip) {
                    if (fVar26 < fVar2) {
                      fVar21 = fVar21 + (fVar24 - fVar21) *
                                        (1.0 - (fVar27 - fVar2) / (fVar27 - fVar26));
                      fVar26 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar28 < fVar2) {
                      fVar25 = fVar25 + (fVar22 - fVar25) *
                                        (1.0 - (fVar23 - fVar2) / (fVar23 - fVar28));
                      fVar28 = fVar2;
                    }
                    if (fVar29 < fVar27) {
                      fVar24 = (fVar24 - fVar21) * ((fVar29 - fVar26) / (fVar27 - fVar26)) + fVar21;
                      fVar27 = fVar29;
                    }
                    fVar29 = clip_rect->w;
                    if (fVar29 < fVar23) {
                      fVar22 = (fVar22 - fVar25) * ((fVar29 - fVar28) / (fVar23 - fVar28)) + fVar25;
                      fVar23 = fVar29;
                    }
                    if (fVar23 <= fVar28) {
                      fVar20 = fVar20 + fVar14;
                      bVar4 = false;
                      goto LAB_001a2f90;
                    }
                  }
                  uVar13 = local_54;
                  if (((undefined1  [40])*pIVar12 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar13 = col;
                  }
                  (local_60->pos).x = fVar26;
                  (local_60->pos).y = fVar28;
                  local_60->col = uVar13;
                  (local_60->uv).x = fVar21;
                  (local_60->uv).y = fVar25;
                  local_60[1].pos.x = fVar27;
                  local_60[1].pos.y = fVar28;
                  local_60[1].col = uVar13;
                  local_60[1].uv.x = fVar24;
                  local_60[1].uv.y = fVar25;
                  local_60[2].pos.x = fVar27;
                  local_60[2].pos.y = fVar23;
                  local_60[2].col = uVar13;
                  local_60[2].uv.x = fVar24;
                  local_60[2].uv.y = fVar22;
                  local_60[3].pos.x = fVar26;
                  local_60[3].pos.y = fVar23;
                  local_60[3].col = uVar13;
                  local_60[3].uv.x = fVar21;
                  local_60[3].uv.y = fVar22;
                  uVar13 = (uint)local_70;
                  *local_68 = uVar13;
                  local_68[1] = uVar13 + 1;
                  local_68[2] = uVar13 + 2;
                  local_68[3] = uVar13;
                  local_68[4] = uVar13 + 2;
                  local_68[5] = uVar13 + 3;
                  local_60 = local_60 + 4;
                  local_70 = (ulong)(uVar13 + 4);
                  local_68 = local_68 + 6;
                }
              }
LAB_001a2f90:
              if (!bVar4) goto LAB_001a2f9f;
            }
            fVar20 = fVar20 + fVar14;
          }
LAB_001a2f9f:
          bVar4 = false;
        }
        text_begin = text_begin + lVar10;
        pcVar8 = pcVar11;
      } while (!bVar4);
LAB_001a2fac:
      (draw_list->VtxBuffer).Size =
           (int)((ulong)((long)local_60 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar5 = (int)((ulong)((long)local_68 - (long)(draw_list->IdxBuffer).Data) >> 2);
      (draw_list->IdxBuffer).Size = iVar5;
      puVar1 = &(draw_list->CmdBuffer).Data[(long)(draw_list->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar5 - (local_4c + local_50));
      draw_list->_VtxWritePtr = local_60;
      draw_list->_IdxWritePtr = local_68;
      draw_list->_VtxCurrentIdx = (uint)local_70;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    float x = IM_TRUNC(pos.x);
    float y = IM_TRUNC(pos.y);
    if (y > clip_rect.w)
        return;

    const float start_x = x;
    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            const char* line_end = (const char*)memchr(s, '\n', text_end - s);
            if (word_wrap_enabled)
            {
                // FIXME-OPT: This is not optimal as do first do a search for \n before calling CalcWordWrapPositionA().
                // If the specs for CalcWordWrapPositionA() were reworked to optionally return on \n we could combine both.
                // However it is still better than nothing performing the fast-forward!
                s = CalcWordWrapPositionA(scale, s, line_end ? line_end : text_end, wrap_width);
                s = CalcWordWrapNextLineStartA(s, text_end);
            }
            else
            {
                s = line_end ? line_end + 1 : text_end;
            }
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);
    ImDrawVert*  vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx*   idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_index = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;
    const char* word_wrap_eol = NULL;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - start_x));

            if (s >= word_wrap_eol)
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
            s += 1;
        else
            s += ImTextCharFromUtf8(&c, s, text_end);

        if (c < 32)
        {
            if (c == '\n')
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    idx_write[0] = (ImDrawIdx)(vtx_index); idx_write[1] = (ImDrawIdx)(vtx_index + 1); idx_write[2] = (ImDrawIdx)(vtx_index + 2);
                    idx_write[3] = (ImDrawIdx)(vtx_index); idx_write[4] = (ImDrawIdx)(vtx_index + 2); idx_write[5] = (ImDrawIdx)(vtx_index + 3);
                    vtx_write += 4;
                    vtx_index += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_index;
}